

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

void __thiscall position::do_move(position *this,Move *m)

{
  bool bVar1;
  Piece PVar2;
  int iVar3;
  Piece *pPVar4;
  U64 UVar5;
  ushort uVar6;
  U64 local_100;
  Piece local_f8;
  Piece local_f4;
  Piece local_e8;
  Piece local_e4;
  ulong local_d8;
  ulong local_d0;
  Color local_b4;
  Square local_b0;
  Square local_ac;
  ushort local_a6;
  Piece local_a4;
  U8 local_9d;
  Piece local_9c;
  U8 local_95;
  Piece local_94;
  Piece local_90;
  U16 local_8a;
  Color local_88;
  U16 local_82;
  Color local_80;
  U16 local_7a;
  Color local_78;
  U16 local_72;
  Color local_70;
  U16 local_6a;
  Color local_68;
  U16 local_62;
  Color local_60;
  U16 local_5a;
  Color local_58;
  U16 local_52;
  Color local_50;
  U16 local_4a;
  Color local_48;
  U16 local_42;
  Color local_40;
  U16 local_3a;
  Color local_38;
  U16 local_32;
  Color local_30;
  Color local_2c;
  Piece local_28;
  Color us;
  Piece p;
  Movetype t;
  Square to;
  Square from;
  Move *m_local;
  position *this_local;
  
  UVar5 = this->hidx;
  this->hidx = UVar5 + 1;
  _to = m;
  m_local = (Move *)this;
  memcpy(this->history + UVar5,&this->ifo,0x60);
  t = (Movetype)_to->f;
  p = (Piece)_to->t;
  us = (Color)_to->type;
  local_28 = piece_on(this,&t);
  local_2c = to_move(this);
  PVar2 = p;
  if (local_28 == king) {
    pPVar4 = std::array<Square,_2UL>::operator[](&(this->pcs).king_sq,(ulong)local_2c);
    *pPVar4 = PVar2;
    (this->ifo).ks[local_2c] = p;
    bVar1 = can_castle_ks(this);
    if ((bVar1) || (bVar1 = can_castle_qs(this), bVar1)) {
      uVar6 = 3;
      if (local_2c == white) {
        uVar6 = 0xc;
      }
      (this->ifo).cmask = (this->ifo).cmask & uVar6;
      if (local_2c == white) {
        local_30 = white;
        local_32 = 0xc;
        local_d0 = zobrist::castle(&local_30,&local_32);
      }
      else {
        local_38 = black;
        local_3a = 3;
        local_d0 = zobrist::castle(&local_38,&local_3a);
      }
      (this->ifo).key = local_d0 ^ (this->ifo).key;
      if (local_2c == white) {
        local_40 = white;
        local_42 = 0xc;
        local_d8 = zobrist::castle(&local_40,&local_42);
      }
      else {
        local_48 = black;
        local_4a = 3;
        local_d8 = zobrist::castle(&local_48,&local_4a);
      }
      (this->ifo).repkey = local_d8 ^ (this->ifo).repkey;
    }
  }
  else if (local_28 == rook) {
    if ((local_2c == white) && (bVar1 = can_castle<(Color)0>(this), bVar1)) {
      if (t == promotion_q) {
        (this->ifo).cmask = (this->ifo).cmask & 0xd;
        local_50 = white;
        local_52 = 0xd;
        UVar5 = zobrist::castle(&local_50,&local_52);
        (this->ifo).key = UVar5 ^ (this->ifo).key;
        local_58 = white;
        local_5a = 0xd;
        UVar5 = zobrist::castle(&local_58,&local_5a);
        (this->ifo).repkey = UVar5 ^ (this->ifo).repkey;
      }
      else if (t == capture_promotion_n) {
        (this->ifo).cmask = (this->ifo).cmask & 0xe;
        local_60 = white;
        local_62 = 0xe;
        UVar5 = zobrist::castle(&local_60,&local_62);
        (this->ifo).key = UVar5 ^ (this->ifo).key;
        local_68 = white;
        local_6a = 0xe;
        UVar5 = zobrist::castle(&local_68,&local_6a);
        (this->ifo).repkey = UVar5 ^ (this->ifo).repkey;
      }
    }
    else if ((local_2c == black) && (bVar1 = can_castle<(Color)1>(this), bVar1)) {
      if (t == 0x38) {
        (this->ifo).cmask = (this->ifo).cmask & 7;
        local_70 = black;
        local_72 = 7;
        UVar5 = zobrist::castle(&local_70,&local_72);
        (this->ifo).key = UVar5 ^ (this->ifo).key;
        local_78 = black;
        local_7a = 7;
        UVar5 = zobrist::castle(&local_78,&local_7a);
        (this->ifo).repkey = UVar5 ^ (this->ifo).repkey;
      }
      else if (t == 0x3f) {
        (this->ifo).cmask = (this->ifo).cmask & 0xb;
        local_80 = black;
        local_82 = 0xb;
        UVar5 = zobrist::castle(&local_80,&local_82);
        (this->ifo).key = UVar5 ^ (this->ifo).key;
        local_88 = black;
        local_8a = 0xb;
        UVar5 = zobrist::castle(&local_88,&local_8a);
        (this->ifo).repkey = UVar5 ^ (this->ifo).repkey;
      }
    }
  }
  (this->ifo).captured = no_piece;
  if (us == 10) {
    piece_data::do_quiet(&this->pcs,&local_2c,&local_28,&t,&p,&this->ifo);
  }
  else if (us == 0xb) {
    PVar2 = piece_on(this,&p);
    (this->ifo).captured = PVar2;
    piece_data::do_cap(&this->pcs,&local_2c,&local_28,&t,&p,&this->ifo);
  }
  else if (us == 0xc) {
    (this->ifo).captured = pawn;
    piece_data::do_ep(&this->pcs,&local_2c,&t,&p,&this->ifo);
  }
  else if ((int)us < 4) {
    if (us == white) {
      local_e4 = queen;
    }
    else {
      if (us == black) {
        local_e8 = rook;
      }
      else {
        local_e8 = knight;
        if (us == colors) {
          local_e8 = bishop;
        }
      }
      local_e4 = local_e8;
    }
    local_90 = local_e4;
    piece_data::do_promotion(&this->pcs,&local_2c,&local_90,&t,&p,&this->ifo);
  }
  else if ((int)us < 8) {
    PVar2 = piece_on(this,&p);
    (this->ifo).captured = PVar2;
    if (us == 4) {
      local_f4 = queen;
    }
    else {
      if (us == 5) {
        local_f8 = rook;
      }
      else {
        local_f8 = knight;
        if (us == 6) {
          local_f8 = bishop;
        }
      }
      local_f4 = local_f8;
    }
    local_94 = local_f4;
    piece_data::do_promotion_cap(&this->pcs,&local_2c,&local_94,&t,&p,&this->ifo);
  }
  else if (us == 8) {
    piece_data::do_castle_ks(&this->pcs,&local_2c,&t,&p,&this->ifo);
    uVar6 = 3;
    if (local_2c == white) {
      uVar6 = 0xc;
    }
    (this->ifo).cmask = (this->ifo).cmask & uVar6;
    (this->ifo).has_castled[local_2c] = true;
  }
  else if (us == 9) {
    piece_data::do_castle_qs(&this->pcs,&local_2c,&t,&p,&this->ifo);
    uVar6 = 3;
    if (local_2c == white) {
      uVar6 = 0xc;
    }
    (this->ifo).cmask = (this->ifo).cmask & uVar6;
    (this->ifo).has_castled[local_2c] = true;
  }
  (this->ifo).eps = no_square;
  if (local_28 == pawn) {
    iVar3 = t - p;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    if (iVar3 == 0x10) {
      iVar3 = -8;
      if (local_2c == white) {
        iVar3 = 8;
      }
      (this->ifo).eps = t + iVar3;
      local_9c = p;
      iVar3 = util::col((int *)&local_9c);
      local_95 = (U8)iVar3;
      UVar5 = zobrist::ep(&local_95);
      (this->ifo).key = UVar5 ^ (this->ifo).key;
      local_a4 = p;
      iVar3 = util::col((int *)&local_a4);
      local_9d = (U8)iVar3;
      UVar5 = zobrist::ep(&local_9d);
      (this->ifo).repkey = UVar5 ^ (this->ifo).repkey;
    }
  }
  if ((local_28 == pawn) || (us == 0xb)) {
    (this->ifo).move50 = '\0';
  }
  else {
    (this->ifo).move50 = (this->ifo).move50 + '\x01';
  }
  local_a6 = (ushort)(this->ifo).move50;
  UVar5 = zobrist::mv50(&local_a6);
  (this->ifo).key = UVar5 ^ (this->ifo).key;
  (this->ifo).hmvs = (this->ifo).hmvs + 1;
  UVar5 = zobrist::hmvs(&(this->ifo).hmvs);
  (this->ifo).key = UVar5 ^ (this->ifo).key;
  (this->ifo).stm = (this->ifo).stm ^ black;
  UVar5 = zobrist::stm(&(this->ifo).stm);
  (this->ifo).key = UVar5 ^ (this->ifo).key;
  UVar5 = zobrist::stm(&(this->ifo).stm);
  (this->ifo).repkey = UVar5 ^ (this->ifo).repkey;
  local_ac = king_square(this);
  bVar1 = is_attacked(this,&local_ac,&(this->ifo).stm,&local_2c,0);
  (this->ifo).incheck = bVar1;
  if (((this->ifo).incheck & 1U) == 0) {
    local_100 = 0;
  }
  else {
    local_b0 = king_square(this);
    local_b4 = (this->ifo).stm ^ black;
    local_100 = attackers_of2(this,&local_b0,&local_b4);
  }
  (this->ifo).checkers = local_100;
  UVar5 = pinned(this,(this->ifo).stm);
  (this->ifo).pinned[(this->ifo).stm] = UVar5;
  UVar5 = pinned(this,(this->ifo).stm ^ black);
  (this->ifo).pinned[(int)((this->ifo).stm ^ black)] = UVar5;
  this->nodes_searched = this->nodes_searched + 1;
  return;
}

Assistant:

void position::do_move(const Move& m) {
	history[hidx++] = ifo;
	const Square from = Square(m.f);
	const Square to = Square(m.t);
	const Movetype t = Movetype(m.type);
	const Piece p = piece_on(from);
	const Color us = to_move();

	// king square update and castle rights update
	if (p == king) {
		pcs.king_sq[us] = to;
		ifo.ks[us] = to;
		if (can_castle_ks() || can_castle_qs()) {
			ifo.cmask &= (us == white ? clearw : clearb);
			ifo.key ^= (us == white ? zobrist::castle(white, clearw) : zobrist::castle(black, clearb));
			ifo.repkey ^= (us == white ? zobrist::castle(white, clearw) : zobrist::castle(black, clearb));
		}
	}
	else if (p == rook) {
		if (us == white && can_castle<white>()) {
			if (from == A1) {
				ifo.cmask &= clearwqs;
				ifo.key ^= zobrist::castle(white, clearwqs);
				ifo.repkey ^= zobrist::castle(white, clearwqs);
			}
			else if (from == H1) {
				ifo.cmask &= clearwks;
				ifo.key ^= zobrist::castle(white, clearwks);
				ifo.repkey ^= zobrist::castle(white, clearwks);
			}
		}
		else if (us == black && can_castle<black>()) {
			if (from == A8) {
				ifo.cmask &= clearbqs;
				ifo.key ^= zobrist::castle(black, clearbqs);
				ifo.repkey ^= zobrist::castle(black, clearbqs);
			}
			else if (from == H8) {
				ifo.cmask &= clearbks;
				ifo.key ^= zobrist::castle(black, clearbks);
				ifo.repkey ^= zobrist::castle(black, clearbks);
			}
		}
	}

	ifo.captured = no_piece;

	if (t == quiet) {
		pcs.do_quiet(us, p, from, to, ifo);
	}

	else if (t == capture) {
		ifo.captured = piece_on(to);
		pcs.do_cap(us, p, from, to, ifo);
	}

	else if (t == ep) {
		ifo.captured = pawn;
		pcs.do_ep(us, from, to, ifo);
	}

	else if (t < capture_promotion_q) pcs.do_promotion(us, (t == promotion_q ? queen :
		t == promotion_r ? rook :
		t == promotion_b ? bishop :
		knight), from, to, ifo);

	else if (t < castle_ks) {
		ifo.captured = piece_on(to);
		pcs.do_promotion_cap(us, (t == capture_promotion_q ? queen :
			t == capture_promotion_r ? rook :
			t == capture_promotion_b ? bishop :
			knight), from, to, ifo);
	}

	else if (t == castle_ks) {
		pcs.do_castle_ks(us, from, to, ifo);
		ifo.cmask &= (us == white ? clearw : clearb);
		ifo.has_castled[us] = true;
	}

	else if (t == castle_qs) {
		pcs.do_castle_qs(us, from, to, ifo);
		ifo.cmask &= (us == white ? clearw : clearb);
		ifo.has_castled[us] = true;
	}

	// eps
	ifo.eps = no_square;
	if (p == pawn && abs(from - to) == 16) {
		ifo.eps = Square(from + (us == white ? 8 : -8));
		ifo.key ^= zobrist::ep(util::col(to));
		ifo.repkey ^= zobrist::ep(util::col(to));
	}

	// move50
	if (p == pawn || t == capture) ifo.move50 = 0;
	else ifo.move50++;
	ifo.key ^= zobrist::mv50(ifo.move50);

	// half-moves
	ifo.hmvs++;
	ifo.key ^= zobrist::hmvs(ifo.hmvs);

	// side to move
	ifo.stm = Color(ifo.stm ^ 1);
	ifo.key ^= zobrist::stm(ifo.stm);
	ifo.repkey ^= zobrist::stm(ifo.stm);

	ifo.incheck = is_attacked(king_square(), ifo.stm, us);
	ifo.checkers = (ifo.incheck ? attackers_of2(king_square(), Color(ifo.stm ^ 1)) : 0ULL);
	ifo.pinned[ifo.stm] = pinned(ifo.stm);
	ifo.pinned[ifo.stm ^ 1] = pinned(Color(ifo.stm ^ 1));
	++nodes_searched;
}